

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Declaration>::copyAppend
          (QGenericArrayOps<QCss::Declaration> *this,Declaration *b,Declaration *e)

{
  Declaration *pDVar1;
  DeclarationData *pDVar2;
  long lVar3;
  
  if (b != e) {
    pDVar1 = (this->super_QArrayDataPointer<QCss::Declaration>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QCss::Declaration>).size;
      pDVar2 = (b->d).d.ptr;
      pDVar1[lVar3].d.d.ptr = pDVar2;
      if (pDVar2 != (DeclarationData *)0x0) {
        LOCK();
        (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<QCss::Declaration>).size;
      }
      (this->super_QArrayDataPointer<QCss::Declaration>).size = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }